

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O1

void Genetic::generate_population(void)

{
  Solution *pSVar1;
  _List_node_base *p_Var2;
  int iVar3;
  
  pSVar1 = Hillclimbing::run(10000);
  p_Var2 = (_List_node_base *)operator_new(0x20);
  p_Var2[1]._M_next = (_List_node_base *)pSVar1;
  p_Var2[1]._M_prev = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  solutions_abi_cxx11_.
  super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>.
  _M_impl._M_node._M_size =
       solutions_abi_cxx11_.
       super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
       ._M_impl._M_node._M_size + 1;
  if (1 < population_limit) {
    iVar3 = 1;
    do {
      pSVar1 = Utils::random_solution();
      if (max_weight < pSVar1->weight) {
        max_weight = pSVar1->weight;
      }
      p_Var2 = (_List_node_base *)operator_new(0x20);
      p_Var2[1]._M_next = (_List_node_base *)pSVar1;
      p_Var2[1]._M_prev = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var2);
      solutions_abi_cxx11_.
      super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
      ._M_impl._M_node._M_size =
           solutions_abi_cxx11_.
           super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
           ._M_impl._M_node._M_size + 1;
      iVar3 = iVar3 + 1;
    } while (iVar3 < population_limit);
  }
  max_weight = max_weight + max_weight;
  return;
}

Assistant:

void Genetic::generate_population()
{
	//std::cout << "Generating population\n";
	//The first solution is the best that hillclimbing can get	
	auto solution = Hillclimbing::run();
	//auto solution = Utils::random_solution();

	solutions.push_back(std::pair<Solution*, double>(solution, 0));
	for (int i = 1; i < population_limit; ++i)
	{
		solution = Utils::random_solution();

		if (solution->weight > max_weight)
			max_weight = solution->weight;

		solutions.push_back(std::pair<Solution*, double>(solution, 0));
	}
	//ticket_max = pow(ticket_max, 2); // to much
	max_weight *= 2;
	//std::cout << "Initial solutions calculated\n";
}